

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  int local_84;
  size_t local_78;
  undefined1 local_60 [8];
  ZSTD_parameters params;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  if (dict == (void *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = dictSize;
  }
  params.fParams._4_8_ = dict;
  ZSTD_getParams_internal
            ((ZSTD_parameters *)local_60,compressionLevel,srcSize,local_78,ZSTD_cpm_noAttachDict);
  if (params.cParams.targetLength == 1) {
    if (compressionLevel == 0) {
      local_84 = 3;
    }
    else {
      local_84 = compressionLevel;
    }
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams,(ZSTD_parameters *)local_60,local_84);
    sVar1 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,(void *)params.fParams._4_8_,dictSize,
                       &cctx->simpleApiParams);
    return sVar1;
  }
  __assert_fail("params.fParams.contentSizeFlag == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x147a,
                "size_t ZSTD_compress_usingDict(ZSTD_CCtx *, void *, size_t, const void *, size_t, const void *, size_t, int)"
               );
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0, ZSTD_cpm_noAttachDict);
        assert(params.fParams.contentSizeFlag == 1);
        ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT: compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compress_usingDict (srcSize=%u)", (unsigned)srcSize);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctx->simpleApiParams);
}